

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snapshot.cpp
# Opt level: O3

int * __thiscall CSnapshotBuilder::GetItemData(CSnapshotBuilder *this,int Key)

{
  long lVar1;
  
  if (0 < (long)this->m_NumItems) {
    lVar1 = 0;
    do {
      if (*(int *)(this->m_aData + this->m_aOffsets[lVar1]) == Key) {
        return (int *)(this->m_aData + (long)this->m_aOffsets[lVar1] + 4);
      }
      lVar1 = lVar1 + 1;
    } while (this->m_NumItems != lVar1);
  }
  return (int *)0x0;
}

Assistant:

int *CSnapshotBuilder::GetItemData(int Key) const
{
	for(int i = 0; i < m_NumItems; i++)
	{
		if(GetItem(i)->Key() == Key)
			return GetItem(i)->Data();
	}
	return 0;
}